

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFIter.H
# Opt level: O1

CutFab * __thiscall amrex::MultiCutFab::operator[](MultiCutFab *this,MFIter *mfi)

{
  int *piVar1;
  
  piVar1 = &mfi->currentIndex;
  if (mfi->local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
    piVar1 = (mfi->local_index_map->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             + *piVar1;
  }
  return (this->m_data).m_fabs_v.
         super__Vector_base<amrex::CutFab_*,_std::allocator<amrex::CutFab_*>_>._M_impl.
         super__Vector_impl_data._M_start[*piVar1];
}

Assistant:

int LocalIndex () const noexcept { return local_index_map ? (*local_index_map)[currentIndex] : currentIndex; }